

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O2

void duckdb::UDFWrapper::RegisterFunction<duckdb::string_t,duckdb::string_t>
               (string *name,scalar_function_t *udf_function,ClientContext *context,
               LogicalType *varargs)

{
  _Manager_type p_Var1;
  vector<duckdb::LogicalType,_true> arguments;
  LogicalType ret_type;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type local_c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b8;
  LogicalType local_a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  LogicalType local_70 [24];
  LogicalType local_58 [24];
  string local_40 [32];
  
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetArgumentTypesRecursive<duckdb::string_t>((vector<duckdb::LogicalType,_true> *)&local_b8);
  GetArgumentType<duckdb::string_t>();
  std::__cxx11::string::string(local_40,(string *)name);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,&local_b8);
  duckdb::LogicalType::LogicalType(local_a0,local_70);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (_Manager_type)0x0;
  local_c0 = udf_function->_M_invoker;
  p_Var1 = (udf_function->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_d8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(udf_function->super__Function_base)._M_functor;
    local_d8._8_8_ = *(undefined8 *)((long)&(udf_function->super__Function_base)._M_functor + 8);
    (udf_function->super__Function_base)._M_manager = (_Manager_type)0x0;
    udf_function->_M_invoker = (_Invoker_type)0x0;
    local_c8 = p_Var1;
  }
  duckdb::LogicalType::LogicalType(local_58,varargs);
  duckdb::UDFWrapper::RegisterFunction(local_40,&local_88,local_a0,&local_d8,context,local_58);
  duckdb::LogicalType::~LogicalType(local_58);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  duckdb::LogicalType::~LogicalType(local_a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  std::__cxx11::string::~string(local_40);
  duckdb::LogicalType::~LogicalType(local_70);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b8);
  return;
}

Assistant:

inline static void RegisterFunction(const string &name, scalar_function_t udf_function, ClientContext &context,
	                                    LogicalType varargs = LogicalType(LogicalTypeId::INVALID)) {
		vector<LogicalType> arguments;
		GetArgumentTypesRecursive<ARGS...>(arguments);

		LogicalType ret_type = GetArgumentType<TR>();

		RegisterFunction(name, arguments, ret_type, std::move(udf_function), context, std::move(varargs));
	}